

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetCodeGenerator.cc
# Opt level: O2

void __thiscall flow::TargetCodeGenerator::generate(TargetCodeGenerator *this,IRHandler *handler)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar1;
  list<std::pair<flow::MatchInstr_*,_unsigned_long>,_std::allocator<std::pair<flow::MatchInstr_*,_unsigned_long>_>_>
  *this_00;
  pointer puVar2;
  pointer puVar3;
  pointer puVar4;
  Instr *pIVar5;
  _List_node_base *p_Var6;
  pointer pMVar7;
  mapped_type mVar8;
  MatchInstr *this_01;
  size_t sVar9;
  mapped_type *pmVar10;
  BasicBlock *pBVar11;
  pointer puVar12;
  long lVar13;
  _Prime_rehash_policy *p_Var14;
  _List_node_base *p_Var15;
  __node_base *p_Var16;
  __node_base *p_Var17;
  long lVar18;
  bool bVar19;
  BasicBlock *bb;
  pointer local_88;
  MatchInstr *local_78;
  BasicBlock *local_70;
  unordered_map<flow::BasicBlock_*,_unsigned_long,_std::hash<flow::BasicBlock_*>,_std::equal_to<flow::BasicBlock_*>,_std::allocator<std::pair<flow::BasicBlock_*const,_unsigned_long>_>_>
  basicBlockEntryPoints;
  
  sVar9 = ConstantPool::makeHandler(&this->cp_,handler);
  this->handlerId_ = sVar9;
  basicBlockEntryPoints._M_h._M_buckets = &basicBlockEntryPoints._M_h._M_single_bucket;
  basicBlockEntryPoints._M_h._M_bucket_count = 1;
  basicBlockEntryPoints._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  basicBlockEntryPoints._M_h._M_element_count = 0;
  basicBlockEntryPoints._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  basicBlockEntryPoints._M_h._M_rehash_policy._M_next_resize = 0;
  basicBlockEntryPoints._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pvVar1 = &this->code_;
  p_Var15 = (_List_node_base *)&handler->blocks_;
  while (p_Var15 = (((_List_base<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
                      *)&p_Var15->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var15 != (_List_node_base *)&handler->blocks_) {
    bb = (BasicBlock *)p_Var15[1]._M_next;
    puVar2 = (this->code_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
             .super__Vector_impl_data._M_start;
    puVar3 = (this->code_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
             .super__Vector_impl_data._M_finish;
    pmVar10 = std::__detail::
              _Map_base<flow::BasicBlock_*,_std::pair<flow::BasicBlock_*const,_unsigned_long>,_std::allocator<std::pair<flow::BasicBlock_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<flow::BasicBlock_*>,_std::hash<flow::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<flow::BasicBlock_*,_std::pair<flow::BasicBlock_*const,_unsigned_long>,_std::allocator<std::pair<flow::BasicBlock_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<flow::BasicBlock_*>,_std::hash<flow::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&basicBlockEntryPoints,&bb);
    *pmVar10 = (long)puVar3 - (long)puVar2 >> 3;
    puVar4 = (bb->code_).
             super__Vector_base<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar12 = (bb->code_).
                   super__Vector_base<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>,_std::allocator<std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar12 != puVar4;
        puVar12 = puVar12 + 1) {
      pIVar5 = (puVar12->_M_t).super___uniq_ptr_impl<flow::Instr,_std::default_delete<flow::Instr>_>
               ._M_t.super__Tuple_impl<0UL,_flow::Instr_*,_std::default_delete<flow::Instr>_>.
               super__Head_base<0UL,_flow::Instr_*,_false>._M_head_impl;
      (**(code **)((long)(pIVar5->super_Value)._vptr_Value + 0x20))(pIVar5,this);
    }
  }
  p_Var16 = &(this->conditionalJumps_)._M_h._M_before_begin;
  while (p_Var16 = p_Var16->_M_nxt, p_Var16 != (__node_base *)0x0) {
    pmVar10 = std::__detail::
              _Map_base<flow::BasicBlock_*,_std::pair<flow::BasicBlock_*const,_unsigned_long>,_std::allocator<std::pair<flow::BasicBlock_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<flow::BasicBlock_*>,_std::hash<flow::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<flow::BasicBlock_*,_std::pair<flow::BasicBlock_*const,_unsigned_long>,_std::allocator<std::pair<flow::BasicBlock_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<flow::BasicBlock_*>,_std::hash<flow::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&basicBlockEntryPoints,(key_type *)(p_Var16 + 1));
    mVar8 = *pmVar10;
    puVar2 = (pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    p_Var14 = (_Prime_rehash_policy *)(p_Var16 + 2);
    while (p_Var14 = *(_Prime_rehash_policy **)&p_Var14->_M_max_load_factor,
          p_Var14 != (_Prime_rehash_policy *)(p_Var16 + 2)) {
      puVar2[(long)*(_Hash_node_base **)(p_Var14 + 1)] =
           (ulong)*(ushort *)&((_Hash_node_base *)((long)(p_Var14 + 1) + 8))->_M_nxt |
           (long)((int)mVar8 << 0x10);
    }
  }
  std::
  _Hashtable<flow::BasicBlock_*,_std::pair<flow::BasicBlock_*const,_std::__cxx11::list<flow::TargetCodeGenerator::ConditionalJump,_std::allocator<flow::TargetCodeGenerator::ConditionalJump>_>_>,_std::allocator<std::pair<flow::BasicBlock_*const,_std::__cxx11::list<flow::TargetCodeGenerator::ConditionalJump,_std::allocator<flow::TargetCodeGenerator::ConditionalJump>_>_>_>,_std::__detail::_Select1st,_std::equal_to<flow::BasicBlock_*>,_std::hash<flow::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->conditionalJumps_)._M_h);
  p_Var17 = &(this->unconditionalJumps_)._M_h._M_before_begin;
  while (p_Var17 = p_Var17->_M_nxt, p_Var17 != (__node_base *)0x0) {
    pmVar10 = std::__detail::
              _Map_base<flow::BasicBlock_*,_std::pair<flow::BasicBlock_*const,_unsigned_long>,_std::allocator<std::pair<flow::BasicBlock_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<flow::BasicBlock_*>,_std::hash<flow::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<flow::BasicBlock_*,_std::pair<flow::BasicBlock_*const,_unsigned_long>,_std::allocator<std::pair<flow::BasicBlock_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<flow::BasicBlock_*>,_std::hash<flow::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&basicBlockEntryPoints,(key_type *)(p_Var17 + 1));
    mVar8 = *pmVar10;
    puVar2 = (pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    p_Var14 = (_Prime_rehash_policy *)(p_Var17 + 2);
    while (p_Var14 = *(_Prime_rehash_policy **)&p_Var14->_M_max_load_factor,
          p_Var14 != (_Prime_rehash_policy *)(p_Var17 + 2)) {
      puVar2[(long)*(_Hash_node_base **)(p_Var14 + 1)] =
           (ulong)*(ushort *)&((_Hash_node_base *)((long)(p_Var14 + 1) + 8))->_M_nxt |
           (long)((int)mVar8 << 0x10);
    }
  }
  std::
  _Hashtable<flow::BasicBlock_*,_std::pair<flow::BasicBlock_*const,_std::__cxx11::list<flow::TargetCodeGenerator::UnconditionalJump,_std::allocator<flow::TargetCodeGenerator::UnconditionalJump>_>_>,_std::allocator<std::pair<flow::BasicBlock_*const,_std::__cxx11::list<flow::TargetCodeGenerator::UnconditionalJump,_std::allocator<flow::TargetCodeGenerator::UnconditionalJump>_>_>_>,_std::__detail::_Select1st,_std::equal_to<flow::BasicBlock_*>,_std::hash<flow::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->unconditionalJumps_)._M_h);
  this_00 = &this->matchHints_;
  p_Var15 = (_List_node_base *)this_00;
  while( true ) {
    p_Var15 = (((_List_base<std::pair<flow::MatchInstr_*,_unsigned_long>,_std::allocator<std::pair<flow::MatchInstr_*,_unsigned_long>_>_>
                 *)&p_Var15->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var15 == (_List_node_base *)this_00) break;
    local_78 = (MatchInstr *)p_Var15[1]._M_next;
    p_Var6 = p_Var15[1]._M_prev;
    MatchInstr::cases((vector<std::pair<flow::Constant_*,_flow::BasicBlock_*>,_std::allocator<std::pair<flow::Constant_*,_flow::BasicBlock_*>_>_>
                       *)&bb,local_78);
    pMVar7 = (this->cp_).matchDefs_.
             super__Vector_base<flow::MatchDef,_std::allocator<flow::MatchDef>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar18 = (long)local_88 - (long)bb >> 4;
    lVar13 = 8;
    while (this_01 = local_78, bVar19 = lVar18 != 0, lVar18 = lVar18 + -1, bVar19) {
      pmVar10 = std::__detail::
                _Map_base<flow::BasicBlock_*,_std::pair<flow::BasicBlock_*const,_unsigned_long>,_std::allocator<std::pair<flow::BasicBlock_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<flow::BasicBlock_*>,_std::hash<flow::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<flow::BasicBlock_*,_std::pair<flow::BasicBlock_*const,_unsigned_long>,_std::allocator<std::pair<flow::BasicBlock_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<flow::BasicBlock_*>,_std::hash<flow::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&basicBlockEntryPoints,
                             (key_type *)((long)&(bb->super_Value)._vptr_Value + lVar13));
      *(mapped_type *)
       (*(long *)&pMVar7[(long)p_Var6].cases.
                  super__Vector_base<flow::MatchCaseDef,_std::allocator<flow::MatchCaseDef>_>.
                  _M_impl.super__Vector_impl_data + lVar13) = *pmVar10;
      lVar13 = lVar13 + 0x10;
    }
    pBVar11 = MatchInstr::elseBlock(local_78);
    if (pBVar11 != (BasicBlock *)0x0) {
      local_70 = MatchInstr::elseBlock(this_01);
      pmVar10 = std::__detail::
                _Map_base<flow::BasicBlock_*,_std::pair<flow::BasicBlock_*const,_unsigned_long>,_std::allocator<std::pair<flow::BasicBlock_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<flow::BasicBlock_*>,_std::hash<flow::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<flow::BasicBlock_*,_std::pair<flow::BasicBlock_*const,_unsigned_long>,_std::allocator<std::pair<flow::BasicBlock_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<flow::BasicBlock_*>,_std::hash<flow::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&basicBlockEntryPoints,&local_70);
      pMVar7[(long)p_Var6].elsePC = *pmVar10;
    }
    std::
    _Vector_base<std::pair<flow::Constant_*,_flow::BasicBlock_*>,_std::allocator<std::pair<flow::Constant_*,_flow::BasicBlock_*>_>_>
    ::~_Vector_base((_Vector_base<std::pair<flow::Constant_*,_flow::BasicBlock_*>,_std::allocator<std::pair<flow::Constant_*,_flow::BasicBlock_*>_>_>
                     *)&bb);
  }
  std::__cxx11::
  list<std::pair<flow::MatchInstr_*,_unsigned_long>,_std::allocator<std::pair<flow::MatchInstr_*,_unsigned_long>_>_>
  ::clear(this_00);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
            (&(this->cp_).handlers_.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[this->handlerId_].second,pvVar1);
  std::deque<const_flow::Value_*,_std::allocator<const_flow::Value_*>_>::clear(&this->stack_);
  std::
  _Hashtable<flow::BasicBlock_*,_std::pair<flow::BasicBlock_*const,_unsigned_long>,_std::allocator<std::pair<flow::BasicBlock_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<flow::BasicBlock_*>,_std::hash<flow::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&basicBlockEntryPoints._M_h);
  return;
}

Assistant:

void TargetCodeGenerator::generate(IRHandler* handler) {
  // explicitely forward-declare handler, so we can use its ID internally.
  handlerId_ = cp_.makeHandler(handler);

  std::unordered_map<BasicBlock*, size_t> basicBlockEntryPoints;

  // generate code for all basic blocks, sequentially
  for (BasicBlock* bb : handler->basicBlocks()) {
    basicBlockEntryPoints[bb] = getInstructionPointer();
    for (Instr* instr : bb->instructions()) {
      instr->accept(*this);
    }
  }

  // fixiate conditional jump instructions
  for (const auto& target : conditionalJumps_) {
    size_t targetPC = basicBlockEntryPoints[target.first];
    for (const auto& source : target.second) {
      code_[source.pc] = makeInstruction(source.opcode, targetPC);
    }
  }
  conditionalJumps_.clear();

  // fixiate unconditional jump instructions
  for (const auto& target : unconditionalJumps_) {
    size_t targetPC = basicBlockEntryPoints[target.first];
    for (const auto& source : target.second) {
      code_[source.pc] = makeInstruction(source.opcode, targetPC);
    }
  }
  unconditionalJumps_.clear();

  // fixiate match jump table
  for (const auto& hint : matchHints_) {
    size_t matchId = hint.second;
    MatchInstr* matchInstr = hint.first;
    const auto& cases = matchInstr->cases();
    MatchDef& def = cp_.getMatchDef(matchId);

    for (size_t i = 0, e = cases.size(); i != e; ++i) {
      def.cases[i].pc = basicBlockEntryPoints[cases[i].second];
    }

    if (matchInstr->elseBlock()) {
      def.elsePC = basicBlockEntryPoints[matchInstr->elseBlock()];
    }
  }
  matchHints_.clear();

  cp_.getHandler(handlerId_).second = std::move(code_);

  // cleanup remaining handler-local work vars
  //FLOW_TRACE("flow: stack depth after handler code generation: {}", stack_.size());
  stack_.clear();
}